

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_models.cpp
# Opt level: O0

int FindGFXFile(FString *fn)

{
  int iVar1;
  long lVar2;
  FString local_40;
  int local_34;
  char **ppcStack_30;
  int lump_1;
  char **extp;
  int slash;
  int dot;
  int best;
  int lump;
  FString *fn_local;
  
  _best = fn;
  dot = FWadCollection::CheckNumForFullName(&Wads,fn,false,0);
  fn_local._4_4_ = dot;
  if (dot == -1) {
    slash = -1;
    lVar2 = FString::LastIndexOf(_best,'.');
    extp._4_4_ = (int)lVar2;
    lVar2 = FString::LastIndexOf(_best,'/');
    extp._0_4_ = (int)lVar2;
    if ((int)extp < extp._4_4_) {
      FString::Truncate(_best,(long)extp._4_4_);
    }
    for (ppcStack_30 = FindGFXFile::extensions; *ppcStack_30 != (char *)0x0;
        ppcStack_30 = ppcStack_30 + 1) {
      FString::operator+(&local_40,(char *)_best);
      iVar1 = FWadCollection::CheckNumForFullName(&Wads,&local_40,false,0);
      FString::~FString(&local_40);
      if (slash <= iVar1) {
        slash = iVar1;
      }
      local_34 = iVar1;
    }
    fn_local._4_4_ = slash;
  }
  return fn_local._4_4_;
}

Assistant:

static int FindGFXFile(FString & fn)
{
	int lump = Wads.CheckNumForFullName(fn);	// if we find something that matches the name plus the extension, return it and do not enter the substitution logic below.
	if (lump != -1) return lump;

	int best = -1;
	int dot = fn.LastIndexOf('.');
	int slash = fn.LastIndexOf('/');
	if (dot > slash) fn.Truncate(dot);

	static const char * extensions[] = { ".png", ".jpg", ".tga", ".pcx", nullptr };

	for (const char ** extp=extensions; *extp; extp++)
	{
		int lump = Wads.CheckNumForFullName(fn + *extp);
		if (lump >= best)  best = lump;
	}
	return best;
}